

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSetNonStationary.cpp
# Opt level: O0

size_t __thiscall BeliefSetNonStationary::Size(BeliefSetNonStationary *this)

{
  size_type sVar1;
  size_t sVar2;
  BeliefSetNonStationary *in_RDI;
  Index t;
  size_t size;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = 0;
  local_14 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
            ::size(&in_RDI->_m_beliefSets);
    if (local_14 == sVar1) break;
    sVar2 = Size(in_RDI,0);
    local_10 = sVar2 + local_10;
    local_14 = local_14 + 1;
  }
  return local_10;
}

Assistant:

size_t BeliefSetNonStationary::Size() const
{
    size_t size=0;
    for(Index t=0;t!=_m_beliefSets.size();++t)
        size+=Size(t);
    return(size);
}